

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall BigNum::BigNum(BigNum *this)

{
  _Vector_base<int,_std::allocator<int>_> local_28;
  
  (this->digits).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->digits).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->digits).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->sign = true;
  this->length = 0;
  local_28._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&this->digits,&local_28);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_28);
  return;
}

Assistant:

BigNum operator -(BigNum a, BigNum b) {
    BigNum c = BigNum();
    int debt = 0;
    if (a.sign == b.sign) {
        if (a.length > b.length) {
            for (int i = 0; i < a.length - b.length; i++) {
                b.digits.push_back(0);
                b.length++;
            }
        } else if (b.length > a.length) {
            for (int i = 0; i < b.length - a.length; i++) {
                a.digits.push_back(0);
                a.length++;
            }

        }
        if (abs(a) > abs(b)) {
            for (int i = 0; i < a.length; i++) {
                if (debt == 1) {
                    a.digits[i]--;
                    debt = 0;
                }
                if (a.digits[i] < b.digits[i]) {
                    debt = 1;
                    a.digits[i] += 10;
                }
                c.digits.push_back(a.digits[i] - b.digits[i]);
            }
            c.length = c.digits.size();
            for (int i = c.length - 1; i > 0; i--) {
                if (c.digits[i] == 0) {
                    c.digits.pop_back();
                    c.length--;
                }
                else
                    break;
            }
            c.sign = true;
        }
        if (abs(b) > abs(a)) {
            for (int i = 0; i < b.length; i++) {
                if (debt == 1) {
                    b.digits[i]--;
                    debt = 0;
                }
                if (b.digits[i] < a.digits[i]) {
                    debt = 1;
                    b.digits[i] += 10;
                }
                c.digits.push_back(b.digits[i] - a.digits[i]);
            }
            c.length = c.digits.size();
            for (int i = c.length - 1; i > 0; i--) {
                if (c.digits[i] == 0) {
                    c.digits.pop_back();
                    c.length--;
                }
                else
                    break;
            }
            c.sign = false; //false??
        }
        if (abs(a) == abs(b)) {
            c = BigNum("0");
            c.sign = true;
        }
    }
    else {
        if (a.sign && !b.sign){
            c = abs(a) + abs(b);
            c.sign = true;
        }
        else{
            c = abs(b) + abs(a);
            c.sign = false;
        }

    }
    return c;
}